

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

int __thiscall re2::Regexp::Ref(Regexp *this)

{
  pthread_rwlock_t *__rwlock;
  int iVar1;
  int iVar2;
  mapped_type *pmVar3;
  Regexp *local_20;
  
  __rwlock = ref_mutex;
  if (this->ref_ != 0xffff) {
    return (uint)this->ref_;
  }
  iVar1 = pthread_rwlock_wrlock(ref_mutex);
  if (iVar1 == 0) {
    local_20 = this;
    pmVar3 = std::
             map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
             ::operator[](ref_map,&local_20);
    iVar1 = *pmVar3;
    iVar2 = pthread_rwlock_unlock(__rwlock);
    if (iVar2 == 0) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

int Regexp::Ref() {
  if (ref_ < kMaxRef)
    return ref_;

  MutexLock l(ref_mutex);
  return (*ref_map)[this];
}